

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O3

bool uWS::WebSocketProtocol<true,uWS::WebSocketContext<false,true>>::
     consumeMessage<14u,unsigned_long>
               (unsigned_long payLength,char **src,uint *length,WebSocketState<true> *wState,
               void *user)

{
  char cVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  OpCode OVar8;
  bool bVar9;
  long lVar10;
  char *pcVar11;
  byte bVar12;
  OpCode OVar13;
  uint uVar14;
  ulong uVar15;
  
  OVar13 = **src;
  OVar8 = *(OpCode *)&wState->state;
  if ((OVar13 & 0xf) == 0) {
    if ((OVar8 & 0x60) == 0x60) goto LAB_00143098;
  }
  else {
    if (((OVar8 & 0x60) == 0x20) || ((OVar13 & 0xf) == TEXT && -1 < (char)OVar8)) goto LAB_00143098;
    bVar12 = (OVar8 >> 5) + 1;
    OVar8 = OVar8 & 0x9f | (bVar12 & 3) << 5;
    *(OpCode *)&wState->state = OVar8;
    (wState->state).opCode[(long)((ulong)bVar12 << 0x3e) >> 0x3e] = OVar13 & 0xf;
    OVar13 = **src;
  }
  *(OpCode *)&wState->state = OVar8 & 0x7f | OVar13 & 0x80;
  us_socket_context(0,user);
  lVar10 = us_socket_context_ext(0);
  if (payLength <= *(ulong *)(lVar10 + 0xa0)) {
    uVar15 = payLength + 0xe;
    if (*length < uVar15) {
      *(byte *)&wState->state = *(byte *)&wState->state & 0xe0;
      wState->remainingBytes = ((int)payLength - *length) + 0xe;
      bVar12 = **src;
      *(undefined4 *)wState->mask = *(undefined4 *)(*src + 10);
      pcVar11 = *src;
      uVar7 = *length;
      lVar10 = 0;
      do {
        pcVar11[lVar10 * 4] = wState->mask[0] ^ pcVar11[lVar10 * 4 + 0xe];
        pcVar11[lVar10 * 4 + 1] = wState->mask[1] ^ pcVar11[lVar10 * 4 + 0xf];
        pcVar11[lVar10 * 4 + 2] = wState->mask[2] ^ pcVar11[lVar10 * 4 + 0x10];
        pcVar11[lVar10 * 4 + 3] = wState->mask[3] ^ pcVar11[lVar10 * 4 + 0x11];
        lVar10 = lVar10 + 1;
      } while ((uVar7 - 0xe >> 2) + 1 != (int)lVar10);
      uVar7 = *length;
      uVar14 = uVar7 & 3 ^ 2;
      cVar1 = wState->mask[1];
      cVar2 = wState->mask[2];
      cVar3 = wState->mask[3];
      uVar15 = (ulong)(-uVar14 & 3);
      wState->mask[uVar15] = wState->mask[0];
      wState->mask[1 - uVar14 & 3] = cVar1;
      wState->mask[uVar15 ^ 2] = cVar2;
      wState->mask[(ulong)(uVar7 & 3) ^ 1] = cVar3;
      WebSocketContext<false,_true>::handleFragment
                (*src,(ulong)(*length - 0xe),wState->remainingBytes,
                 (uint)(wState->state).opCode[(char)(*(char *)&wState->state * '\x02') >> 6],
                 (bool)(bVar12 >> 7),wState,user);
      return true;
    }
    pcVar11 = *src;
    bVar12 = pcVar11[10];
    bVar4 = pcVar11[0xb];
    bVar5 = pcVar11[0xc];
    bVar6 = pcVar11[0xd];
    lVar10 = 0;
    do {
      pcVar11[lVar10 * 4 + 10] = pcVar11[lVar10 * 4 + 0xe] ^ bVar12;
      pcVar11[lVar10 * 4 + 0xb] = pcVar11[lVar10 * 4 + 0xf] ^ bVar4;
      pcVar11[lVar10 * 4 + 0xc] = pcVar11[lVar10 * 4 + 0x10] ^ bVar5;
      pcVar11[lVar10 * 4 + 0xd] = pcVar11[lVar10 * 4 + 0x11] ^ bVar6;
      lVar10 = lVar10 + 1;
    } while (((uint)(payLength >> 2) & 0x3fffffff) + 1 != (int)lVar10);
    bVar9 = WebSocketContext<false,_true>::handleFragment
                      (*src + 10,payLength,0,
                       (uint)(wState->state).opCode[(char)(*(char *)&wState->state * '\x02') >> 6],
                       (bool)((byte)**src >> 7),wState,user);
    if (!bVar9) {
      pcVar11 = *src;
      if (*pcVar11 < '\0') {
        *(byte *)&wState->state =
             *(byte *)&wState->state & 0x9f | *(byte *)&wState->state + 0x60 & 0x60;
        pcVar11 = *src;
      }
      *src = pcVar11 + uVar15;
      *length = *length - (int)uVar15;
      *(byte *)&wState->state = *(byte *)&wState->state & 0xe1;
      return false;
    }
    return true;
  }
LAB_00143098:
  us_socket_close(0,user);
  return true;
}

Assistant:

static inline bool consumeMessage(T payLength, char *&src, unsigned int &length, WebSocketState<isServer> *wState, void *user) {
        if (getOpCode(src)) {
            if (wState->state.opStack == 1 || (!wState->state.lastFin && getOpCode(src) < 2)) {
                Impl::forceClose(wState, user);
                return true;
            }
            wState->state.opCode[++wState->state.opStack] = (OpCode) getOpCode(src);
        } else if (wState->state.opStack == -1) {
            Impl::forceClose(wState, user);
            return true;
        }
        wState->state.lastFin = isFin(src);

        if (Impl::refusePayloadLength(payLength, wState, user)) {
            Impl::forceClose(wState, user);
            return true;
        }

        if (payLength + MESSAGE_HEADER <= length) {
            if (isServer) {
                unmaskImpreciseCopyMask(src + MESSAGE_HEADER - 4, src + MESSAGE_HEADER, src + MESSAGE_HEADER - 4, (unsigned int) payLength);
                if (Impl::handleFragment(src + MESSAGE_HEADER - 4, payLength, 0, wState->state.opCode[wState->state.opStack], isFin(src), wState, user)) {
                    return true;
                }
            } else {
                if (Impl::handleFragment(src + MESSAGE_HEADER, payLength, 0, wState->state.opCode[wState->state.opStack], isFin(src), wState, user)) {
                    return true;
                }
            }

            if (isFin(src)) {
                wState->state.opStack--;
            }

            src += payLength + MESSAGE_HEADER;
            length -= (unsigned int) (payLength + MESSAGE_HEADER);
            wState->state.spillLength = 0;
            return false;
        } else {
            wState->state.spillLength = 0;
            wState->state.wantsHead = false;
            wState->remainingBytes = (unsigned int) (payLength - length + MESSAGE_HEADER);
            bool fin = isFin(src);
            if (isServer) {
                memcpy(wState->mask, src + MESSAGE_HEADER - 4, 4);
                unmaskImprecise(src, src + MESSAGE_HEADER, wState->mask, length - MESSAGE_HEADER);
                rotateMask(4 - (length - MESSAGE_HEADER) % 4, wState->mask);
            } else {
                src += MESSAGE_HEADER;
            }
            Impl::handleFragment(src, length - MESSAGE_HEADER, wState->remainingBytes, wState->state.opCode[wState->state.opStack], fin, wState, user);
            return true;
        }
    }